

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QRegularExpression __thiscall QVariant::toRegularExpression(QVariant *this)

{
  QExplicitlySharedDataPointer<QRegularExpressionPrivate> in_RDI;
  QVariant *in_stack_00000028;
  
  qvariant_cast<QRegularExpression>(in_stack_00000028);
  return (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
         (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)in_RDI.d.ptr;
}

Assistant:

QRegularExpression QVariant::toRegularExpression() const
{
    return qvariant_cast<QRegularExpression>(*this);
}